

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O0

shared_ptr<gui::Slider> gui::Slider::create(shared_ptr<gui::SliderStyle> *style,String *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<gui::Slider> sVar1;
  element_type *this;
  String *in_stack_ffffffffffffffd0;
  shared_ptr<gui::SliderStyle> *in_stack_ffffffffffffffd8;
  Slider *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  operator_new(0x260);
  std::shared_ptr<gui::SliderStyle>::shared_ptr
            ((shared_ptr<gui::SliderStyle> *)this,(shared_ptr<gui::SliderStyle> *)in_RDI);
  Slider(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::shared_ptr<gui::Slider>::shared_ptr<gui::Slider,void>((shared_ptr<gui::Slider> *)this,in_RDI)
  ;
  std::shared_ptr<gui::SliderStyle>::~shared_ptr((shared_ptr<gui::SliderStyle> *)0x1d6956);
  sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::Slider>)sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Slider> Slider::create(std::shared_ptr<SliderStyle> style, const sf::String& name) {
    return std::shared_ptr<Slider>(new Slider(style, name));
}